

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

void Gia_ManTransferMapping(Gia_Man_t *p,Gia_Man_t *pGia)

{
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar1;
  int *piVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint Entry;
  long lVar7;
  long lVar8;
  
  if (pGia->vMapping == (Vec_Int_t *)0x0) {
    return;
  }
  Gia_ManMappingVerify(pGia);
  if (p->vMapping != (Vec_Int_t *)0x0) {
    piVar2 = p->vMapping->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vMapping->pArray = (int *)0x0;
    }
    if (p->vMapping != (Vec_Int_t *)0x0) {
      free(p->vMapping);
      p->vMapping = (Vec_Int_t *)0x0;
    }
  }
  uVar5 = p->nObjs;
  pVVar1 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < uVar5 * 2 - 1) {
    iVar6 = uVar5 * 2;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar6;
  if (iVar6 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar6 << 2);
  }
  pVVar1->pArray = piVar2;
  p->vMapping = pVVar1;
  if (iVar6 < (int)uVar5) {
    if (piVar2 == (int *)0x0) {
      piVar2 = (int *)malloc((long)(int)uVar5 << 2);
    }
    else {
      piVar2 = (int *)realloc(piVar2,(long)(int)uVar5 << 2);
    }
    pVVar1->pArray = piVar2;
    if (piVar2 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar1->nCap = uVar5;
  }
  if (0 < (int)uVar5) {
    memset(pVVar1->pArray,0,(ulong)uVar5 * 4);
  }
  pVVar1->nSize = uVar5;
  if (1 < pGia->nObjs) {
    lVar8 = 1;
    do {
      pVVar1 = pGia->vMapping;
      if (pVVar1->nSize <= lVar8) goto LAB_006f11ff;
      piVar2 = pVVar1->pArray;
      if (piVar2[lVar8] != 0) {
        uVar5 = pGia->pObjs[lVar8].Value;
        if ((int)uVar5 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf3,"int Abc_LitIsCompl(int)");
        }
        if ((uVar5 & 1) != 0) {
          __assert_fail("!Abc_LitIsCompl(Gia_ObjValue(Gia_ManObj(pGia, i)))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                        ,0x7ea,"void Gia_ManTransferMapping(Gia_Man_t *, Gia_Man_t *)");
        }
        uVar5 = uVar5 >> 1;
        if (p->nObjs <= (int)uVar5) {
LAB_006f121e:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        p_00 = p->vMapping;
        if (p_00->nSize <= (int)uVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p_00->pArray[uVar5] = p_00->nSize;
        if (pVVar1->nSize <= lVar8) {
LAB_006f11ff:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar6 = piVar2[lVar8];
        if (((long)iVar6 < 0) || (pVVar1->nSize <= iVar6)) goto LAB_006f11ff;
        Vec_IntPush(p_00,piVar2[iVar6]);
        pVVar1 = pGia->vMapping;
        lVar3 = (long)pVVar1->nSize;
        if (lVar3 <= lVar8) goto LAB_006f11ff;
        lVar7 = 0;
        while( true ) {
          iVar6 = pVVar1->pArray[lVar8];
          if (((long)iVar6 < 0) || ((int)lVar3 <= iVar6)) goto LAB_006f11ff;
          piVar2 = pVVar1->pArray + iVar6;
          if (*piVar2 <= lVar7) break;
          iVar6 = piVar2[lVar7 + 1];
          if (((long)iVar6 < 0) || (pGia->nObjs <= iVar6)) goto LAB_006f121e;
          uVar5 = pGia->pObjs[iVar6].Value;
          if ((int)uVar5 < 0) goto LAB_006f123d;
          Vec_IntPush(p->vMapping,uVar5 >> 1);
          lVar7 = lVar7 + 1;
          pVVar1 = pGia->vMapping;
          lVar3 = (long)pVVar1->nSize;
          if (lVar3 <= lVar8) goto LAB_006f11ff;
        }
        uVar5 = piVar2[(long)*piVar2 + 1];
        uVar4 = -uVar5;
        if (0 < (int)uVar5) {
          uVar4 = uVar5;
        }
        if (pGia->nObjs <= (int)uVar4) goto LAB_006f121e;
        uVar4 = pGia->pObjs[uVar4].Value;
        if ((int)uVar4 < 0) {
LAB_006f123d:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        uVar4 = uVar4 >> 1;
        Entry = -uVar4;
        if (-1 < (int)uVar5) {
          Entry = uVar4;
        }
        Vec_IntPush(p->vMapping,Entry);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pGia->nObjs);
  }
  Gia_ManMappingVerify(p);
  return;
}

Assistant:

void Gia_ManTransferMapping( Gia_Man_t * p, Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj;
    int i, k, iFan;
    if ( !Gia_ManHasMapping(pGia) )
        return;
    Gia_ManMappingVerify( pGia );
    Vec_IntFreeP( &p->vMapping );
    p->vMapping = Vec_IntAlloc( 2 * Gia_ManObjNum(p) );
    Vec_IntFill( p->vMapping, Gia_ManObjNum(p), 0 );
    Gia_ManForEachLut( pGia, i )
    {
        assert( !Abc_LitIsCompl(Gia_ObjValue(Gia_ManObj(pGia, i))) );
        pObj = Gia_ManObj( p, Abc_Lit2Var(Gia_ObjValue(Gia_ManObj(pGia, i))) );
        Vec_IntWriteEntry( p->vMapping, Gia_ObjId(p, pObj), Vec_IntSize(p->vMapping) );
        Vec_IntPush( p->vMapping, Gia_ObjLutSize(pGia, i) );
        Gia_LutForEachFanin( pGia, i, iFan, k )
            Vec_IntPush( p->vMapping, Abc_Lit2Var(Gia_ObjValue(Gia_ManObj(pGia, iFan))) );
        iFan = Abc_Lit2Var( Gia_ObjValue(Gia_ManObj(pGia, Abc_AbsInt(Gia_ObjLutMuxId(pGia, i)))) );
        Vec_IntPush( p->vMapping, Gia_ObjLutIsMux(pGia, i) ? -iFan : iFan );
    }
    Gia_ManMappingVerify( p );
}